

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O3

CFGNode * __thiscall
dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling
          (CFGStructurizer *this,CFGNode *node,CFGNode *header,CFGNode *loop_ladder,
          CFGNode *target_header,CFGNode *full_break_target,
          UnorderedSet<const_CFGNode_*> *normal_preds)

{
  uint uVar1;
  uint uVar2;
  pointer ppCVar3;
  pointer ppCVar4;
  CFGNode *pCVar5;
  long lVar6;
  size_type sVar7;
  int iVar8;
  ulong uVar9;
  CFGNode *pCVar10;
  CFGNode *pCVar11;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> *pbVar12;
  LoggingCallback p_Var13;
  void *pvVar14;
  ulong uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
  *paVar16;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  __i;
  long lVar17;
  CFGNode **ppCVar18;
  _Alloc_hider _Var19;
  CFGNode **ppCVar20;
  undefined8 *puVar21;
  Vector<CFGNode_*> linear_visitation_cache;
  UnorderedSet<CFGNode_*> visitation_cache;
  String local_1098;
  CFGNode **local_1070;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_1068;
  CFGStructurizer *local_1048;
  CFGNode *local_1040;
  _Any_data local_1038;
  undefined6 uStack_1028;
  undefined2 uStack_1022;
  code *pcStack_1020;
  undefined4 local_1018;
  undefined8 local_1010;
  __node_base_ptr ap_Stack_1008 [507];
  
  if (target_header == (CFGNode *)0x0 && full_break_target == (CFGNode *)0x0) {
    if ((loop_ladder->ir).operations.
        super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (loop_ladder->ir).operations.
        super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      traverse_dominated_blocks_and_rewrite_branch(this,header,node,loop_ladder);
      return (CFGNode *)0x0;
    }
    pCVar10 = create_helper_pred_block(this,loop_ladder);
    pCVar11 = create_helper_succ_block(this,loop_ladder);
    traverse_dominated_blocks_and_rewrite_branch(this,header,node,pCVar10);
    local_1038._8_6_ = 0;
    local_1038._14_2_ = 0;
    local_1038._M_unused._M_object = normal_preds;
    pcStack_1020 = std::
                   _Function_handler<bool_(const_dxil_spv::CFGNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp:6670:5)>
                   ::_M_invoke;
    uStack_1028 = 0x14546e;
    uStack_1022 = 0;
    local_1068._M_dataplus._M_p = (pointer)&local_1068.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>> *)
               &local_1068,"ladder_phi_","");
    pbVar12 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              _M_append(&local_1068,(loop_ladder->name)._M_dataplus._M_p,
                        (loop_ladder->name)._M_string_length);
    local_1098._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
    paVar16 = &pbVar12->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
         *)local_1098._M_dataplus._M_p == paVar16) {
      local_1098.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
      local_1098.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
      local_1098._M_dataplus._M_p = (pointer)&local_1098.field_2;
    }
    else {
      local_1098.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    }
    local_1098._M_string_length = pbVar12->_M_string_length;
    (pbVar12->_M_dataplus)._M_p = (pointer)paVar16;
    pbVar12->_M_string_length = 0;
    (pbVar12->field_2)._M_local_buf[0] = '\0';
    rewrite_ladder_conditional_branch_from_incoming_blocks
              (this,pCVar10,pCVar11,loop_ladder,
               (function<bool_(const_dxil_spv::CFGNode_*)> *)&local_1038,&local_1098);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
         *)local_1098._M_dataplus._M_p != &local_1098.field_2) {
      free_in_thread(local_1098._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
         *)local_1068._M_dataplus._M_p != &local_1068.field_2) {
      free_in_thread(local_1068._M_dataplus._M_p);
    }
    if ((code *)CONCAT26(uStack_1022,uStack_1028) == (code *)0x0) {
      return pCVar10;
    }
    (*(code *)CONCAT26(uStack_1022,uStack_1028))(&local_1038,&local_1038,3);
    return pCVar10;
  }
  pCVar10 = create_helper_pred_block(this,loop_ladder);
  ppCVar3 = (node->headers).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppCVar4 = (node->headers).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  uVar15 = (long)ppCVar4 - (long)ppCVar3 >> 3;
  if ((int)uVar15 == 0) {
    if (ppCVar4 == ppCVar3) goto LAB_0013fff5;
LAB_0013fb90:
    iVar8 = 0;
    if (node->succ_back_edge != node && node->succ_back_edge != (CFGNode *)0x0) goto LAB_0013fbad;
  }
  else {
    uVar9 = 0;
    do {
      if (ppCVar3[uVar9] == header) goto LAB_0013fa9c;
      uVar9 = uVar9 + 1;
    } while ((int)uVar15 != (int)uVar9);
    uVar9 = uVar15 & 0xffffffff;
LAB_0013fa9c:
    iVar8 = (int)uVar9;
    if (uVar15 == (uVar9 & 0xffffffff)) {
LAB_0013fff5:
      __assert_fail("header_index != node->headers.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0x19bf,
                    "CFGNode *dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(CFGNode *, CFGNode *, CFGNode *, CFGNode *, CFGNode *, const UnorderedSet<const CFGNode *> &)"
                   );
    }
    if (iVar8 == 0) goto LAB_0013fb90;
LAB_0013fbad:
    local_1068._M_dataplus._M_p = (pointer)node;
    local_1068._M_string_length._0_4_ = iVar8;
    if (pCVar10 != node) {
      local_1038._M_unused._M_object = ap_Stack_1008;
      local_1038._8_6_ = 1;
      local_1038._14_2_ = 0;
      uStack_1028 = 0;
      uStack_1022 = 0;
      pcStack_1020 = (code *)0x0;
      local_1018 = 0x3f800000;
      local_1010 = 0;
      ap_Stack_1008[0] = (__node_base_ptr)0x0;
      local_1048 = this;
      traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__2>
                (this,header,header,node,pCVar10,(anon_class_16_2_63404077 *)&local_1068,
                 (UnorderedSet<CFGNode_*> *)&local_1038);
      CFGNode::fixup_merge_info_after_branch_rewrite(header,node,pCVar10);
      local_1098._M_dataplus._M_p = (pointer)0x0;
      local_1098._M_string_length = 0;
      local_1098.field_2._M_allocated_capacity = 0;
      std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
      reserve((vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_> *)
              &local_1098,(size_type)pcStack_1020);
      for (puVar21 = (undefined8 *)CONCAT26(uStack_1022,uStack_1028);
          sVar7 = local_1098._M_string_length, puVar21 != (undefined8 *)0x0;
          puVar21 = (undefined8 *)*puVar21) {
        local_1040 = (CFGNode *)puVar21[1];
        if (local_1040->immediate_post_dominator == node) {
          if ((local_1040->fake_succ).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              (local_1040->fake_succ).
              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            local_1040->immediate_post_dominator = (CFGNode *)0x0;
            if (local_1098._M_string_length == local_1098.field_2._M_allocated_capacity) {
              std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>::
              _M_realloc_insert<dxil_spv::CFGNode*const&>
                        ((vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>
                          *)&local_1098,(iterator)local_1098._M_string_length,&local_1040);
            }
            else {
              *(CFGNode **)local_1098._M_string_length = local_1040;
              local_1098._M_string_length = local_1098._M_string_length + 8;
            }
          }
          else {
            local_1040->immediate_post_dominator = pCVar10;
          }
        }
      }
      _Var19._M_p = local_1098._M_dataplus._M_p;
      ppCVar20 = (CFGNode **)local_1098._M_string_length;
      if (local_1098._M_dataplus._M_p != (pointer)local_1098._M_string_length) {
        lVar17 = local_1098._M_string_length - (long)local_1098._M_dataplus._M_p;
        uVar15 = lVar17 >> 3;
        lVar6 = 0x3f;
        if (uVar15 != 0) {
          for (; uVar15 >> lVar6 == 0; lVar6 = lVar6 + -1) {
          }
        }
        local_1070 = (CFGNode **)local_1098._M_dataplus._M_p;
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__2>(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__2_const&)::_lambda(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)_1_>>
                  (local_1098._M_dataplus._M_p,local_1098._M_string_length,
                   ((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar17 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__2>(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__2_const&)::_lambda(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)_1_>>
                    (local_1070,sVar7);
          _Var19._M_p = local_1098._M_dataplus._M_p;
          ppCVar20 = (CFGNode **)local_1098._M_string_length;
        }
        else {
          ppCVar18 = local_1070 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_comp_iter<dxil_spv::CFGStructurizer::traverse_dominated_blocks_and_rewrite_branch<dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__2>(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGStructurizer::build_ladder_block_for_escaping_edge_handling(dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,dxil_spv::CFGNode*,std::unordered_set<dxil_spv::CFGNode_const*,std::hash<dxil_spv::CFGNode_const*>,std::equal_to<dxil_spv::CFGNode_const*>,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_const*>>const&)::__2_const&)::_lambda(dxil_spv::CFGNode_const*,dxil_spv::CFGNode_const*)_1_>>
                    (local_1070,ppCVar18);
          for (; _Var19._M_p = local_1098._M_dataplus._M_p,
              ppCVar20 = (CFGNode **)local_1098._M_string_length, ppCVar18 != (CFGNode **)sVar7;
              ppCVar18 = ppCVar18 + 1) {
            pCVar11 = ppCVar18[-1];
            pCVar5 = *ppCVar18;
            uVar1 = pCVar5->forward_post_visit_order;
            uVar2 = pCVar11->forward_post_visit_order;
            ppCVar20 = ppCVar18;
            while (uVar1 < uVar2) {
              *ppCVar20 = pCVar11;
              pCVar11 = ppCVar20[-2];
              ppCVar20 = ppCVar20 + -1;
              uVar2 = pCVar11->forward_post_visit_order;
            }
            *ppCVar20 = pCVar5;
          }
        }
      }
      for (; (CFGNode **)_Var19._M_p != ppCVar20; _Var19._M_p = (pointer)((long)_Var19._M_p + 8)) {
        if ((*(CFGNode **)_Var19._M_p)->immediate_post_dominator == (CFGNode *)0x0) {
          CFGNode::recompute_immediate_post_dominator(*(CFGNode **)_Var19._M_p);
        }
      }
      CFGNode::recompute_immediate_post_dominator(header);
      if ((CFGNode **)local_1098._M_dataplus._M_p != (CFGNode **)0x0) {
        free_in_thread(local_1098._M_dataplus._M_p);
      }
      std::
      _Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<dxil_spv::CFGNode_*,_dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>,_std::__detail::_Identity,_std::equal_to<dxil_spv::CFGNode_*>,_std::hash<dxil_spv::CFGNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&local_1038);
      this = local_1048;
    }
  }
  if (target_header == (CFGNode *)0x0) {
    pCVar11 = full_break_target;
    if (full_break_target == (CFGNode *)0x0) {
LAB_0013ffa9:
      p_Var13 = get_thread_log_callback();
      if (p_Var13 != (LoggingCallback)0x0) {
        local_1038._M_unused._M_object = (void *)0x20706f6f6c206f4e;
        local_1038._8_6_ = 0x20656772656d;
        local_1038._14_2_ = 0x6c62;
        uStack_1028 = 0xa3f6b636f;
        pvVar14 = get_thread_log_callback_userdata();
        (*p_Var13)(pvVar14,Warn,local_1038._M_pod_data);
        return pCVar10;
      }
      build_ladder_block_for_escaping_edge_handling();
      return pCVar10;
    }
  }
  else {
    pCVar11 = target_header->loop_ladder_block;
    if (target_header->loop_ladder_block == (CFGNode *)0x0) {
      pCVar11 = target_header->loop_merge_block;
      if (full_break_target == (CFGNode *)0x0 && pCVar11 == (CFGNode *)0x0) goto LAB_0013ffa9;
      if (pCVar11 != (CFGNode *)0x0) {
        full_break_target = pCVar11;
      }
      pCVar11 = full_break_target;
      if (full_break_target == (CFGNode *)0x0) {
        return pCVar10;
      }
    }
  }
  local_1038._8_6_ = 0;
  local_1038._14_2_ = 0;
  pcStack_1020 = std::
                 _Function_handler<bool_(const_dxil_spv::CFGNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp:6629:30)>
                 ::_M_invoke;
  uStack_1028 = 0x14542e;
  uStack_1022 = 0;
  local_1068._M_dataplus._M_p = (pointer)&local_1068.field_2;
  local_1038._M_unused._M_object = normal_preds;
  std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>::
  _M_construct<char_const*>
            ((basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>> *)
             &local_1068,"ladder_phi_","");
  pbVar12 = std::__cxx11::
            basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
            _M_append(&local_1068,(loop_ladder->name)._M_dataplus._M_p,
                      (loop_ladder->name)._M_string_length);
  local_1098._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
  paVar16 = &pbVar12->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)local_1098._M_dataplus._M_p == paVar16) {
    local_1098.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
    local_1098.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
    local_1098._M_dataplus._M_p = (pointer)&local_1098.field_2;
  }
  else {
    local_1098.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
  }
  local_1098._M_string_length = pbVar12->_M_string_length;
  (pbVar12->_M_dataplus)._M_p = (pointer)paVar16;
  pbVar12->_M_string_length = 0;
  (pbVar12->field_2)._M_local_buf[0] = '\0';
  rewrite_ladder_conditional_branch_from_incoming_blocks
            (this,pCVar10,pCVar11,loop_ladder,
             (function<bool_(const_dxil_spv::CFGNode_*)> *)&local_1038,&local_1098);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)local_1098._M_dataplus._M_p != &local_1098.field_2) {
    free_in_thread(local_1098._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)local_1068._M_dataplus._M_p != &local_1068.field_2) {
    free_in_thread(local_1068._M_dataplus._M_p);
  }
  if ((code *)CONCAT26(uStack_1022,uStack_1028) != (code *)0x0) {
    (*(code *)CONCAT26(uStack_1022,uStack_1028))(&local_1038,&local_1038,3);
  }
  pCVar11 = (pCVar10->ir).terminator.true_block;
  if (pCVar11 == (pCVar10->ir).terminator.false_block) {
    (pCVar10->ir).terminator.direct_block = pCVar11;
    (pCVar10->ir).terminator.type = Branch;
  }
  return pCVar10;
}

Assistant:

CFGNode *CFGStructurizer::build_ladder_block_for_escaping_edge_handling(CFGNode *node, CFGNode *header,
                                                                        CFGNode *loop_ladder,
                                                                        CFGNode *target_header,
                                                                        CFGNode *full_break_target,
                                                                        const UnorderedSet<const CFGNode *> &normal_preds)
{
	CFGNode *new_ladder_block = nullptr;

	if (target_header || full_break_target)
	{
		// If we have a ladder block, there exists a merge candidate which the loop header dominates.
		// We create a ladder block before the merge block, which becomes the true merge block.
		// In this ladder block, we can detect with Phi nodes whether the break was "clean",
		// or if we had an escape edge.
		// If we have an escape edge, we can break to outer level, and continue the ladder that way.
		// Otherwise we branch to the existing merge block and continue as normal.
		// We'll also need to rewrite a lot of Phi nodes this way as well.
		auto *ladder = create_helper_pred_block(loop_ladder);
		new_ladder_block = ladder;

		unsigned header_index;
		for (header_index = 0; header_index < uint32_t(node->headers.size()); header_index++)
			if (node->headers[header_index] == header)
				break;

		assert(header_index != node->headers.size());

		// Merge to ladder instead.
		// If we're fixing up ladders for header index 0 it means we've already rewritten everything,
		// only apply the last fixup branch.
		if (header_index != 0 || block_is_plain_continue(node))
		{
			traverse_dominated_blocks_and_rewrite_branch(
				header, node, ladder,
				[node, header_index](const CFGNode *next)
				{
					for (unsigned i = 0; i < header_index; i++)
					{
						auto *target = node->headers[i];
						// Do not introduce cycles. Outer scopes must never be rewritten to branch to inner scopes.
						if (target && target->loop_ladder_block == next)
							return false;
					}
					return true;
				});
		}

		CFGNode *true_block = nullptr;

		// Ladder breaks out to outer scope.
		if (target_header && target_header->loop_ladder_block)
			true_block = target_header->loop_ladder_block;
		else if (target_header && target_header->loop_merge_block)
			true_block = target_header->loop_merge_block;
		else if (full_break_target)
			true_block = full_break_target;
		else
			LOGW("No loop merge block?\n");

		if (true_block)
		{
			rewrite_ladder_conditional_branch_from_incoming_blocks(
				ladder,
				true_block, loop_ladder, [&](const CFGNode *n) { return normal_preds.count(n) == 0; },
				String("ladder_phi_") + loop_ladder->name);

			// This can happen in some scenarios, fixup the branch to be a direct one instead.
			if (ladder->ir.terminator.true_block == ladder->ir.terminator.false_block)
			{
				ladder->ir.terminator.direct_block = ladder->ir.terminator.true_block;
				ladder->ir.terminator.type = Terminator::Type::Branch;
			}
		}
	}
	else
	{
		// Here, loop_ladder -> final merge is a trivial, direct branch.

		if (loop_ladder->ir.operations.empty())
		{
			// Simplest common case.
			// If the loop ladder just branches to outer scope, and this block does not perform
			// any operations we can avoid messing around with ladder PHI variables and just execute the branch.
			// This block will likely become a frontier node when merging PHI instead.
			// This is a common case when breaking out of a simple for loop.
			traverse_dominated_blocks_and_rewrite_branch(header, node, loop_ladder);
		}
		else
		{
			// We have a case where we're trivially breaking out of a selection construct,
			// but the loop ladder block contains operations which we must not execute,
			// since we were supposed to branch directly out to node.
			// We cannot directly break out of a selection construct, so our ladder must be a bit more sophisticated.
			// ladder-pre -> merge -> ladder-post -> selection merge
			//      \-------------------/
			auto *ladder_pre = create_helper_pred_block(loop_ladder);
			auto *ladder_post = create_helper_succ_block(loop_ladder);

			// Merge to ladder instead.
			traverse_dominated_blocks_and_rewrite_branch(header, node, ladder_pre);

			rewrite_ladder_conditional_branch_from_incoming_blocks(
				ladder_pre,
				ladder_post, loop_ladder,
				[&](const CFGNode *n) { return normal_preds.count(n) == 0; },
				String("ladder_phi_") + loop_ladder->name);

			new_ladder_block = ladder_pre;
		}
	}

	return new_ladder_block;
}